

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbiscan.cpp
# Opt level: O0

void __thiscall icu_63::RBBIRuleScanner::scanSet(RBBIRuleScanner *this)

{
  UnicodeString *pUVar1;
  undefined8 uVar2;
  UBool UVar3;
  UnicodeSet *this_00;
  RBBINode *node;
  size_t size;
  void *pvVar4;
  UnicodeSet *local_78;
  RBBINode *n;
  UErrorCode local_44 [2];
  UErrorCode localStatus;
  int local_30;
  int local_2c;
  int i;
  int startPos;
  ParsePosition pos;
  UnicodeSet *uset;
  RBBIRuleScanner *this_local;
  
  ParsePosition::ParsePosition((ParsePosition *)&i);
  UVar3 = ::U_FAILURE(*this->fRB->fStatus);
  if (UVar3 == '\0') {
    size = (size_t)(uint)this->fScanIndex;
    ParsePosition::setIndex((ParsePosition *)&i,this->fScanIndex);
    local_2c = this->fScanIndex;
    local_44[0] = U_ZERO_ERROR;
    this_00 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,size);
    local_78 = (UnicodeSet *)0x0;
    if (this_00 != (UnicodeSet *)0x0) {
      UnicodeSet::UnicodeSet(this_00);
      local_78 = this_00;
    }
    pos._8_8_ = local_78;
    if (local_78 == (UnicodeSet *)0x0) {
      local_44[0] = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      UnicodeSet::applyPatternIgnoreSpace
                (local_78,this->fRB->fRules,(ParsePosition *)&i,
                 &this->fSymbolTable->super_SymbolTable,local_44);
    }
    UVar3 = ::U_FAILURE(local_44[0]);
    if (UVar3 == '\0') {
      UVar3 = UnicodeSet::isEmpty((UnicodeSet *)pos._8_8_);
      if (UVar3 == '\0') {
        local_30 = ParsePosition::getIndex((ParsePosition *)&i);
        while (this->fNextIndex < local_30) {
          nextCharLL(this);
        }
        UVar3 = ::U_SUCCESS(*this->fRB->fStatus);
        if (UVar3 != '\0') {
          node = pushNewNode(this,setRef);
          UVar3 = ::U_FAILURE(*this->fRB->fStatus);
          if (UVar3 != '\0') {
            local_44[1] = 1;
            goto LAB_0035cf3d;
          }
          node->fFirstPos = local_2c;
          node->fLastPos = this->fNextIndex;
          pUVar1 = this->fRB->fRules;
          (*(pUVar1->super_Replaceable).super_UObject._vptr_UObject[3])
                    (pUVar1,(ulong)(uint)node->fFirstPos,(ulong)(uint)node->fLastPos,&node->fText);
          findSetFor(this,&node->fText,node,(UnicodeSet *)pos._8_8_);
        }
        local_44[1] = 0;
      }
      else {
        pvVar4 = (void *)0x1020b;
        error(this,U_BRK_RULE_EMPTY_SET);
        uVar2 = pos._8_8_;
        if (pos._8_8_ != 0) {
          UnicodeSet::~UnicodeSet((UnicodeSet *)pos._8_8_);
          UMemory::operator_delete((UMemory *)uVar2,pvVar4);
        }
        local_44[1] = 1;
      }
    }
    else {
      pvVar4 = (void *)(ulong)(uint)local_44[0];
      error(this,local_44[0]);
      uVar2 = pos._8_8_;
      if (pos._8_8_ != 0) {
        UnicodeSet::~UnicodeSet((UnicodeSet *)pos._8_8_);
        UMemory::operator_delete((UMemory *)uVar2,pvVar4);
      }
      local_44[1] = 1;
    }
  }
  else {
    local_44[1] = 1;
  }
LAB_0035cf3d:
  ParsePosition::~ParsePosition((ParsePosition *)&i);
  return;
}

Assistant:

void RBBIRuleScanner::scanSet() {
    UnicodeSet    *uset;
    ParsePosition  pos;
    int            startPos;
    int            i;

    if (U_FAILURE(*fRB->fStatus)) {
        return;
    }

    pos.setIndex(fScanIndex);
    startPos = fScanIndex;
    UErrorCode localStatus = U_ZERO_ERROR;
    uset = new UnicodeSet();
    if (uset == NULL) {
        localStatus = U_MEMORY_ALLOCATION_ERROR;
    } else {
        uset->applyPatternIgnoreSpace(fRB->fRules, pos, fSymbolTable, localStatus);
    }
    if (U_FAILURE(localStatus)) {
        //  TODO:  Get more accurate position of the error from UnicodeSet's return info.
        //         UnicodeSet appears to not be reporting correctly at this time.
        #ifdef RBBI_DEBUG
            RBBIDebugPrintf("UnicodeSet parse postion.ErrorIndex = %d\n", pos.getIndex());
        #endif
        error(localStatus);
        delete uset;
        return;
    }

    // Verify that the set contains at least one code point.
    //
    U_ASSERT(uset!=NULL);
    if (uset->isEmpty()) {
        // This set is empty.
        //  Make it an error, because it almost certainly is not what the user wanted.
        //  Also, avoids having to think about corner cases in the tree manipulation code
        //   that occurs later on.
        error(U_BRK_RULE_EMPTY_SET);
        delete uset;
        return;
    }


    // Advance the RBBI parse postion over the UnicodeSet pattern.
    //   Don't just set fScanIndex because the line/char positions maintained
    //   for error reporting would be thrown off.
    i = pos.getIndex();
    for (;;) {
        if (fNextIndex >= i) {
            break;
        }
        nextCharLL();
    }

    if (U_SUCCESS(*fRB->fStatus)) {
        RBBINode         *n;

        n = pushNewNode(RBBINode::setRef);
        if (U_FAILURE(*fRB->fStatus)) {
            return;
        }
        n->fFirstPos = startPos;
        n->fLastPos  = fNextIndex;
        fRB->fRules.extractBetween(n->fFirstPos, n->fLastPos, n->fText);
        //  findSetFor() serves several purposes here:
        //     - Adopts storage for the UnicodeSet, will be responsible for deleting.
        //     - Mantains collection of all sets in use, needed later for establishing
        //          character categories for run time engine.
        //     - Eliminates mulitiple instances of the same set.
        //     - Creates a new uset node if necessary (if this isn't a duplicate.)
        findSetFor(n->fText, n, uset);
    }

}